

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remote_server.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  long lVar1;
  int iVar2;
  __pid_t _Var3;
  uint uVar4;
  __off_t _Var5;
  int *piVar6;
  ostream *poVar7;
  void *pvVar8;
  long in_RSI;
  int in_EDI;
  int Port_1;
  attr_list contact_list;
  FILE *f_1;
  char final_filename_1 [256];
  char filename_1 [256];
  int Port;
  attr_list listen_list;
  int fd;
  char buffer [256];
  FILE *f;
  char final_filename [256];
  char *filename;
  int i;
  ofstream fileOut;
  int no_timeout;
  int status_server;
  int kill_server;
  int background;
  Remote_evpath_state ev_state;
  CManager cm;
  undefined8 in_stack_fffffffffffff848;
  string *psVar9;
  void *in_stack_fffffffffffff850;
  undefined8 in_stack_fffffffffffff8a0;
  undefined8 in_stack_fffffffffffff8b0;
  undefined8 *puVar10;
  int local_71c;
  long local_718;
  string local_710 [32];
  FILE *local_6f0;
  char local_6e8 [256];
  char local_5e8 [268];
  uint local_4dc;
  undefined8 local_4d8;
  int local_4cc;
  undefined1 local_4c8 [264];
  FILE *local_3c0;
  char local_3b8 [280];
  undefined8 local_2a0;
  int local_294;
  undefined1 local_290 [512];
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  undefined8 local_80;
  undefined8 local_18;
  long local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_84 = 0;
  local_88 = 0;
  local_8c = 0;
  local_90 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  std::ofstream::ofstream(local_290);
  local_294 = 1;
  do {
    uVar4 = (uint)((ulong)in_stack_fffffffffffff848 >> 0x20);
    if (local_8 <= local_294) {
      if (local_88 != 0) {
        connect_and_kill((int)((ulong)in_stack_fffffffffffff8b0 >> 0x20));
        exit(0);
      }
      if (local_8c != 0) {
        connect_and_get_status((int)((ulong)in_stack_fffffffffffff8a0 >> 0x20));
        exit(0);
      }
      if (local_84 != 0) {
        if ((verbose != 0) && (report_port_selection == 0)) {
          printf("Forking server to background\n");
        }
        parent_pid = getpid();
        _Var3 = fork();
        if (_Var3 != 0) {
          if (report_port_selection != 0) {
            snprintf(local_3b8,0x100,"/tmp/port_file_%x",(ulong)(uint)parent_pid);
            local_3c0 = (FILE *)0x0;
            local_3c0 = fopen(local_3b8,"r");
            while (local_3c0 == (FILE *)0x0) {
              sleep(1);
              local_3c0 = fopen(local_3b8,"r");
            }
            fread(local_4c8,1,0x100,local_3c0);
            puVar10 = (undefined8 *)&stdout;
            fprintf(_stdout,"%s",local_4c8);
            fflush((FILE *)*puVar10);
          }
          close(0);
          close(1);
          close(2);
          exit(0);
        }
        for (local_4cc = 0; uVar4 = (uint)((ulong)in_stack_fffffffffffff848 >> 0x20),
            local_4cc < 0x11; local_4cc = local_4cc + 1) {
          iVar2 = fd_is_valid(0);
          if (((iVar2 != 0) && (_Var5 = lseek(local_4cc,0,1), _Var5 == -1)) &&
             (piVar6 = __errno_location(), *piVar6 == 0x1d)) {
            close(local_4cc);
          }
        }
      }
      local_18 = CManager_create();
      if (local_90 == 0) {
        timer_start(in_stack_fffffffffffff850,uVar4);
      }
      CM_IP_PORT = attr_atom_from_string("IP_PORT");
      local_4d8 = 0;
      local_4d8 = create_attr_list();
      if (report_port_selection == 0) {
        add_attr(local_4d8,CM_IP_PORT,1,0x6658);
        CMlisten_specific(local_18,local_4d8);
      }
      else {
        CMlisten(local_18);
        local_4d8 = CMget_contact_list(local_18);
        local_4dc = 0xffffffff;
        get_int_attr(local_4d8,CM_IP_PORT,&local_4dc);
        uVar4 = getpid();
        snprintf(local_5e8,0x100,"/tmp/port_file_%x",(ulong)uVar4);
        snprintf(local_6e8,0x100,"/tmp/port_file_%x",(ulong)(uint)parent_pid);
        local_6f0 = fopen(local_5e8,"w");
        random_cookie = rand64();
        fprintf(local_6f0,"port:%d;msg:%s;cookie:%#018lx\n",(ulong)local_4dc,"no_error",
                random_cookie);
        fclose(local_6f0);
        rename(local_5e8,local_6e8);
      }
      poVar7 = std::operator<<((ostream *)&std::cout,"Hostname = ");
      psVar9 = local_710;
      adios2::helper::GetFQDN_abi_cxx11_();
      poVar7 = std::operator<<(poVar7,psVar9);
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_710);
      local_718 = CMget_contact_list(local_18);
      if (local_718 != 0) {
        local_71c = -1;
        get_int_attr(local_4d8,CM_IP_PORT,&local_71c);
        poVar7 = std::operator<<((ostream *)&std::cout,"Listening on Port ");
        pvVar8 = (void *)std::ostream::operator<<(poVar7,local_71c);
        std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
      }
      local_80 = local_18;
      poVar7 = std::operator<<((ostream *)&std::cout,"Max threads = ");
      pvVar8 = (void *)std::ostream::operator<<(poVar7,maxThreads);
      std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
      adios2::EVPathRemoteCommon::RegisterFormats((Remote_evpath_state *)0x119297);
      ServerRegisterHandlers((Remote_evpath_state *)0x1192a6);
      CMrun_network(local_18);
      local_4 = 0;
      std::ofstream::~ofstream(local_290);
      return local_4;
    }
    iVar2 = strcmp(*(char **)(local_10 + (long)local_294 * 8),"-background");
    if (iVar2 == 0) {
      local_84 = local_84 + 1;
    }
    else {
      iVar2 = strcmp(*(char **)(local_10 + (long)local_294 * 8),"-kill_server");
      if (iVar2 == 0) {
        local_88 = local_88 + 1;
      }
      else {
        iVar2 = strcmp(*(char **)(local_10 + (long)local_294 * 8),"-report_port_selection");
        if (iVar2 == 0) {
          report_port_selection = report_port_selection + 1;
        }
        else {
          iVar2 = strcmp(*(char **)(local_10 + (long)local_294 * 8),"-status");
          if (iVar2 == 0) {
            local_8c = local_8c + 1;
          }
          else {
            iVar2 = strcmp(*(char **)(local_10 + (long)local_294 * 8),"-no_timeout");
            if (iVar2 == 0) {
              local_90 = local_90 + 1;
            }
            else {
              iVar2 = strcmp(*(char **)(local_10 + (long)local_294 * 8),"-v");
              if (iVar2 == 0) {
                verbose = verbose + 1;
              }
              else {
                iVar2 = strcmp(*(char **)(local_10 + (long)local_294 * 8),"-q");
                if (iVar2 == 0) {
                  verbose = verbose + -1;
                }
                else {
                  iVar2 = strcmp(*(char **)(local_10 + (long)local_294 * 8),"-l");
                  if (iVar2 == 0) {
                    local_294 = local_294 + 1;
                    if (local_8 <= local_294) {
                      fprintf(_stderr,"Flag -l requires an argument\n");
                      fprintf(_stderr,
                              "Usage:  adios2_remote_server [-background] [-kill_server] [-no_timeout] [-status] [-v] [-q] [-l logfile] [-t nthreads]\n"
                             );
                      exit(1);
                    }
                    local_2a0 = *(undefined8 *)(local_10 + (long)local_294 * 8);
                    std::ofstream::open(local_290,local_2a0,0x10);
                    lVar1 = *(long *)(std::cout + -0x18);
                    std::ofstream::rdbuf();
                    std::ios::rdbuf((streambuf *)((long)&std::cout + lVar1));
                  }
                  else {
                    iVar2 = strcmp(*(char **)(local_10 + (long)local_294 * 8),"-t");
                    if (iVar2 != 0) {
                      fprintf(_stderr,"Unknown argument \"%s\"\n",
                              *(undefined8 *)(local_10 + (long)local_294 * 8));
                      fprintf(_stderr,
                              "Usage:  adios2_remote_server [-background] [-kill_server] [-no_timeout] [-status] [-v] [-q] [-l logfile] [-t nthreads]\n"
                             );
                      exit(1);
                    }
                    local_294 = local_294 + 1;
                    if (local_8 <= local_294) {
                      fprintf(_stderr,"Flag -t requires an argument\n");
                      fprintf(_stderr,
                              "Usage:  adios2_remote_server [-background] [-kill_server] [-no_timeout] [-status] [-v] [-q] [-l logfile] [-t nthreads]\n"
                             );
                      exit(1);
                    }
                    maxThreads = strtol(*(char **)(local_10 + (long)local_294 * 8),(char **)0x0,10);
                  }
                }
              }
            }
          }
        }
      }
    }
    local_294 = local_294 + 1;
  } while( true );
}

Assistant:

int main(int argc, char **argv)
{
    CManager cm;
    struct Remote_evpath_state ev_state;
    int background = 0;
    int kill_server = 0;
    int status_server = 0;
    int no_timeout = 0; // default to timeout
    std::ofstream fileOut;

    for (int i = 1; i < argc; i++)
    {
        if (strcmp(argv[i], "-background") == 0)
        {
            background++;
        }
        else if (strcmp(argv[i], "-kill_server") == 0)
        {
            kill_server++;
        }
        else if (strcmp(argv[i], "-report_port_selection") == 0)
        {
            report_port_selection++;
        }
        else if (strcmp(argv[i], "-status") == 0)
        {
            status_server++;
        }
        else if (strcmp(argv[i], "-no_timeout") == 0)
        {
            no_timeout++;
        }
        else if (strcmp(argv[i], "-v") == 0)
        {
            verbose++;
        }
        else if (strcmp(argv[i], "-q") == 0)
        {
            verbose--;
        }
        else if (strcmp(argv[i], "-l") == 0)
        {
            i++;
            if (argc <= i)
            {
                fprintf(stderr, "Flag -l requires an argument\n");
                fprintf(stderr, usage);
                exit(1);
            }
            char *filename = argv[i];
            // Opening the output file stream and associate it with
            // logfile
            fileOut.open(filename);

            // Redirecting cout to write to logfile
            std::cout.rdbuf(fileOut.rdbuf());
        }
        else if (strcmp(argv[i], "-t") == 0)
        {
            i++;
            if (argc <= i)
            {
                fprintf(stderr, "Flag -t requires an argument\n");
                fprintf(stderr, usage);
                exit(1);
            }
            maxThreads = strtol(argv[i], nullptr, 10);
        }
        else
        {
            fprintf(stderr, "Unknown argument \"%s\"\n", argv[i]);
            fprintf(stderr, usage);
            exit(1);
        }
    }

    if (kill_server)
    {
        connect_and_kill(ServerPort);
        exit(0);
    }
    if (status_server)
    {
        connect_and_get_status(ServerPort);
        exit(0);
    }
    if (background)
    {
        if (verbose && !report_port_selection)
        {
            printf("Forking server to background\n");
        }
#ifdef _MSC_VER
        STARTUPINFO si;
        PROCESS_INFORMATION pi;
        char comm_line[8191];

        ZeroMemory(&si, sizeof(si));
        si.cb = sizeof(si);
        ZeroMemory(&pi, sizeof(pi));
        char module[MAX_PATH];
        GetModuleFileName(NULL, &module[0], MAX_PATH);
        int i = 1;
        strcpy(comm_line, module);
        strcat(comm_line, " ");
        if (!CreateProcess(module, comm_line,
                           NULL,  // Process handle not inheritable
                           NULL,  // Thread handle not inheritable
                           FALSE, // Set handle inheritance to FALSE
                           0,     // No creation flags
                           NULL,  // Use parent's environment block
                           NULL,  // Use parent's starting directory
                           &si,   // Pointer to STARTUPINFO structure
                           &pi))
        {
            printf("CreateProcess failed (%d).\n", GetLastError());
            //	    printf("Args were argv[0] = %s\n", args[0]);
            //	    printf("Args were argv[1] = %s, argv[2] = %s\n", args[1], args[2]);
            exit(1);
        }
        exit(0);
#else
        parent_pid = getpid();
        if (fork() != 0)
        {
            /* I'm the parent, wait a sec to let the child start, then exit */
            //            sleep(1);
            if (report_port_selection)
            {
                char final_filename[256];
                snprintf(final_filename, sizeof(final_filename), "/tmp/port_file_%x", parent_pid);
                FILE *f = NULL;
                f = fopen(final_filename, "r");
                while (f == NULL)
                {
                    sleep(1); // wait until available
                    f = fopen(final_filename, "r");
                }
                char buffer[256];
                fread(buffer, 1, 256, f);
                // Note: printf("%s", buffer); does not seem to flush properly
                fprintf(stdout, "%s", buffer);
                fflush(stdout);
            }
            close(0);
            close(1);
            close(2);
            exit(0);
        }

        //  Why close a bunch of FDs here?  Well, if we've linked with XRootD, stderr might have
        //  been dup()'d in library initialization.  We don't need those FDs and we have to
        //  close them to make sure we disassociate from the CTest parent (or else fixture
        //  startup hangs). It doesn't seem to work to close them before the fork, so we close
        //  them afterwards.
        for (int fd = 0; fd <= 16; fd++)
        {
            if (fd_is_valid(fd))
            {
                // OK, fd is valid, should we close it?
                if ((lseek(fd, 0, SEEK_CUR) == -1) && (errno == ESPIPE))
                {
                    // In the circumstances we care about (running under CTest), we want to
                    // close FDs that are pipes.  The condition above tests for that and we
                    // should get here only if it's a pipe.
                    close(fd);
                }
            }
        }
#endif
    }

    cm = CManager_create();
    if (!no_timeout)
        timer_start((void *)cm, 60 * 1000); // check timeout on 1 minute boundaries
    CM_IP_PORT = attr_atom_from_string("IP_PORT");
    attr_list listen_list = NULL;

    if (listen_list == NULL)
        listen_list = create_attr_list();
    if (!report_port_selection)
    {
        // listen on well-known port
        add_attr(listen_list, CM_IP_PORT, Attr_Int4, (attr_value)ServerPort);
        CMlisten_specific(cm, listen_list);
    }
    else
    {
        // randomize port
        CMlisten(cm);
        listen_list = CMget_contact_list(cm);
        int Port = -1;
        get_int_attr(listen_list, CM_IP_PORT, &Port);
        char filename[256];
        char final_filename[256];
        snprintf(filename, sizeof(filename), "/tmp/port_file_%x", getpid());
        snprintf(final_filename, sizeof(final_filename), "/tmp/port_file_%x", parent_pid);
        FILE *f = fopen(filename, "w");
        random_cookie = rand64();
        fprintf(f, "port:%d;msg:%s;cookie:%#018" PRIx64 "\n", Port, "no_error", random_cookie);
        fclose(f);
        rename(filename, final_filename);
    }

    std::cout << "Hostname = " << helper::GetFQDN() << std::endl;
    attr_list contact_list = CMget_contact_list(cm);
    if (contact_list)
    {
        int Port = -1;
        get_int_attr(listen_list, CM_IP_PORT, &Port);
        std::cout << "Listening on Port " << Port << std::endl;
    }
    ev_state.cm = cm;
    std::cout << "Max threads = " << maxThreads << std::endl;

    RegisterFormats(ev_state);

    ServerRegisterHandlers(ev_state);

    CMrun_network(cm);
    return 0;
}